

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O1

Vec_Int_t * vectorDifference(Vec_Int_t *A,Vec_Int_t *B)

{
  Vec_Int_t *p;
  long lVar1;
  long lVar2;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0;
  p->nSize = 0;
  p->pArray = (int *)0x0;
  if (0 < A->nSize) {
    lVar2 = 0;
    do {
      if (0 < (long)B->nSize) {
        lVar1 = 0;
        do {
          if (B->pArray[lVar1] == A->pArray[lVar2]) goto LAB_0058eb84;
          lVar1 = lVar1 + 1;
        } while (B->nSize != lVar1);
      }
      Vec_IntPush(p,A->pArray[lVar2]);
LAB_0058eb84:
      lVar2 = lVar2 + 1;
    } while (lVar2 < A->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t *vectorDifference(Vec_Int_t *A, Vec_Int_t *B)
{
	Vec_Int_t *C;
	int iElem, i;

	C = Vec_IntAlloc(0);
	Vec_IntForEachEntry( A, iElem, i )
	{
		if( Vec_IntFind( B, iElem ) == -1 )
		{
			Vec_IntPush( C, iElem );
		}
	}

	return C;
}